

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionVariable.cpp
# Opt level: O0

bool __thiscall InductionVariable::Add(InductionVariable *this,int n)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  IntConstantBounds local_34;
  int32 local_2c;
  int32 local_28;
  int newUpperBound;
  int newLowerBound;
  int upperBound;
  int lowerBound;
  int n_local;
  InductionVariable *this_local;
  
  upperBound = n;
  _lowerBound = this;
  bVar2 = IsChangeDeterminate(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InductionVariable.cpp"
                       ,0x4f,"(IsChangeDeterminate())","IsChangeDeterminate()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (upperBound == 0) {
    this_local._7_1_ = true;
  }
  else {
    newLowerBound = IntConstantBounds::LowerBound(&this->changeBounds);
    newUpperBound = IntConstantBounds::UpperBound(&this->changeBounds);
    if ((upperBound < 0) &&
       ((newLowerBound < newUpperBound || ((newLowerBound == newUpperBound && (0 < newLowerBound))))
       )) {
      this->isChangeDeterminate = false;
      this_local._7_1_ = false;
    }
    else if ((upperBound < 1) ||
            ((newLowerBound <= newUpperBound &&
             ((newLowerBound != newUpperBound || (-1 < newLowerBound)))))) {
      iVar3 = IntConstantBounds::LowerBound(&this->changeBounds);
      if (iVar3 == -0x80000000) {
        if (-1 < upperBound) {
          this->isChangeDeterminate = false;
          return false;
        }
        local_28 = -0x80000000;
      }
      else {
        iVar3 = IntConstantBounds::LowerBound(&this->changeBounds);
        if (iVar3 == 0x7fffffff) {
          if (upperBound < 0) {
            this->isChangeDeterminate = false;
            return false;
          }
          local_28 = 0x7fffffff;
        }
        else {
          iVar3 = IntConstantBounds::LowerBound(&this->changeBounds);
          bVar2 = Int32Math::Add(iVar3,upperBound,&local_28);
          if ((bVar2) && (local_28 = 0x7fffffff, upperBound < 0)) {
            local_28 = -0x80000000;
          }
        }
      }
      iVar3 = IntConstantBounds::UpperBound(&this->changeBounds);
      if (iVar3 == -0x80000000) {
        if (-1 < upperBound) {
          this->isChangeDeterminate = false;
          return false;
        }
        local_2c = -0x80000000;
      }
      else {
        iVar3 = IntConstantBounds::UpperBound(&this->changeBounds);
        if (iVar3 == 0x7fffffff) {
          if (upperBound < 0) {
            this->isChangeDeterminate = false;
            return false;
          }
          local_2c = 0x7fffffff;
        }
        else {
          iVar3 = IntConstantBounds::UpperBound(&this->changeBounds);
          bVar2 = Int32Math::Add(iVar3,upperBound,&local_2c);
          if ((bVar2) && (local_2c = 0x7fffffff, upperBound < 0)) {
            local_2c = -0x80000000;
          }
        }
      }
      IntConstantBounds::IntConstantBounds(&local_34,local_28,local_2c);
      this->changeBounds = local_34;
      this_local._7_1_ = true;
    }
    else {
      this->isChangeDeterminate = false;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InductionVariable::Add(const int n)
{
    Assert(IsChangeDeterminate());

    if(n == 0)
        return true;

    int lowerBound = changeBounds.LowerBound();
    int upperBound = changeBounds.UpperBound();

    if (n < 0 && (lowerBound < upperBound || (lowerBound == upperBound && lowerBound > 0)))
    {
        isChangeDeterminate = false;
        return false;
    }

    if (n > 0 && (lowerBound > upperBound || (lowerBound == upperBound && lowerBound < 0)))
    {
        isChangeDeterminate = false;
        return false;
    }

    int newLowerBound;
    if(changeBounds.LowerBound() == IntConstMin)
    {
        if(n >= 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newLowerBound = IntConstMin;
    }
    else if(changeBounds.LowerBound() == IntConstMax)
    {
        if(n < 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newLowerBound = IntConstMax;
    }
    else if(Int32Math::Add(changeBounds.LowerBound(), n, &newLowerBound))
        newLowerBound = n < 0 ? IntConstMin : IntConstMax;

    int newUpperBound;
    if(changeBounds.UpperBound() == IntConstMin)
    {
        if(n >= 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newUpperBound = IntConstMin;
    }
    else if(changeBounds.UpperBound() == IntConstMax)
    {
        if(n < 0)
        {
            isChangeDeterminate = false;
            return false;
        }
        newUpperBound = IntConstMax;
    }
    else if(Int32Math::Add(changeBounds.UpperBound(), n, &newUpperBound))
        newUpperBound = n < 0 ? IntConstMin : IntConstMax;

    changeBounds = IntConstantBounds(newLowerBound, newUpperBound);
    return true;
}